

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::init
          (SingleBindingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering ",10);
  std::ostream::operator<<(poVar1,0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
  std::ostream::operator<<(poVar1,0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," grid.\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Buffer format:\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbufferOffset: ",0xf);
  std::ostream::operator<<(poVar1,(this->m_spec).bufferOffset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbufferStride: ",0xf);
  std::ostream::operator<<(poVar1,(this->m_spec).bufferStride);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Vertex position format:\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ttype: float4\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\toffset: ",9);
  std::ostream::operator<<(poVar1,(this->m_spec).positionAttrOffset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ttotal offset: ",0xf);
  std::ostream::operator<<(poVar1,(this->m_spec).positionAttrOffset + (this->m_spec).bufferOffset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  if ((this->m_spec).hasColorAttr == true) {
    local_190._0_8_ =
         ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Color:\n",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ttype: float4\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\toffset: ",9);
    std::ostream::operator<<(poVar1,(this->m_spec).colorAttrOffset);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ttotal offset: ",0xf);
    std::ostream::operator<<(poVar1,(this->m_spec).colorAttrOffset + (this->m_spec).bufferOffset);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  }
  iVar2 = BindingRenderCase::init(&this->super_BindingRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void SingleBindingCase::init (void)
{
	// log what we are trying to do

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering " << (int)GRID_SIZE << "x" << (int)GRID_SIZE << " grid.\n"
						<< "Buffer format:\n"
						<< "	bufferOffset: " << m_spec.bufferOffset << "\n"
						<< "	bufferStride: " << m_spec.bufferStride << "\n"
						<< "Vertex position format:\n"
						<< "	type: float4\n"
						<< "	offset: " << m_spec.positionAttrOffset << "\n"
						<< "	total offset: " << m_spec.bufferOffset + m_spec.positionAttrOffset << "\n"
						<< tcu::TestLog::EndMessage;

	if (m_spec.hasColorAttr)
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Color:\n"
							<< "	type: float4\n"
							<< "	offset: " << m_spec.colorAttrOffset << "\n"
							<< "	total offset: " << m_spec.bufferOffset + m_spec.colorAttrOffset << "\n"
							<< tcu::TestLog::EndMessage;
	// init

	BindingRenderCase::init();
}